

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_lzhuf.cxx
# Opt level: O0

int __thiscall xray_re::_lzhuf::DecodeChar(_lzhuf *this)

{
  int iVar1;
  uint local_14;
  uint c;
  _lzhuf *this_local;
  
  for (local_14 = this->son[0x272]; local_14 < 0x273; local_14 = this->son[iVar1 + local_14]) {
    iVar1 = GetBit(this);
  }
  update(this,local_14 - 0x273);
  return local_14 - 0x273;
}

Assistant:

int _lzhuf::DecodeChar(void)
{
	unsigned c;

	c = son[R];

	/* travel from root to leaf, */
	/* choosing the smaller child node (son[]) if the read bit is 0, */
	/* the bigger (son[]+1} if 1 */
	while (c < T) {
		c += GetBit();
		c = son[c];
	}
	c -= T;
	update(c);
	return c;
}